

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_hash(void)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int *piVar12;
  undefined8 uVar13;
  code *pcVar14;
  int n_name2_1;
  ulong uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int n_userdata;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  int n_userdata_1;
  undefined8 *puVar23;
  bool bVar24;
  int n_userdata_4;
  int n_name;
  uint uVar25;
  uint uVar26;
  int test_ret_2;
  int test_ret_1;
  int test_ret_3;
  int test_ret_4;
  int test_ret;
  int test_ret_6;
  int test_ret_7;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  uint local_48;
  uint local_44;
  undefined8 local_40;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing hash : 17 of 25 functions ...");
  }
  iVar1 = 0;
  local_68 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      iVar19 = 0;
      do {
        iVar3 = xmlMemBlocks();
        if (bVar22) {
          lVar9 = xmlHashCreate(10);
        }
        else {
          lVar9 = 0;
        }
        if (uVar25 < 4) {
          uVar16 = (&DAT_00165d70)[uVar25];
        }
        else {
          uVar16 = 0;
        }
        piVar12 = &call_tests;
        if (iVar19 != 0) {
          if (iVar19 == 1) {
            piVar12 = (int *)0xffffffffffffffff;
          }
          else {
            piVar12 = (int *)0x0;
          }
        }
        xmlHashAddEntry(lVar9,uVar16,piVar12);
        call_tests = call_tests + 1;
        if (lVar9 != 0) {
          xmlHashFree(lVar9);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashAddEntry",(ulong)(uint)(iVar4 - iVar3));
          iVar1 = iVar1 + 1;
          printf(" %d",local_68);
          printf(" %d",(ulong)uVar25);
          printf(" %d");
          putchar(10);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 != 3);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_68 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  iVar19 = 0;
  local_60 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      uVar21 = 0;
      do {
        iVar3 = 0;
        do {
          iVar4 = xmlMemBlocks();
          if (bVar22) {
            lVar9 = xmlHashCreate(10);
          }
          else {
            lVar9 = 0;
          }
          if (uVar25 < 4) {
            uVar16 = (&DAT_00165d70)[uVar25];
          }
          else {
            uVar16 = 0;
          }
          if ((uint)uVar21 < 4) {
            uVar13 = (&DAT_00165d70)[uVar21];
          }
          else {
            uVar13 = 0;
          }
          piVar12 = &call_tests;
          if (iVar3 != 0) {
            if (iVar3 == 1) {
              piVar12 = (int *)0xffffffffffffffff;
            }
            else {
              piVar12 = (int *)0x0;
            }
          }
          xmlHashAddEntry2(lVar9,uVar16,uVar13,piVar12);
          call_tests = call_tests + 1;
          if (lVar9 != 0) {
            xmlHashFree(lVar9);
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashAddEntry2",(ulong)(uint)(iVar5 - iVar4));
            iVar19 = iVar19 + 1;
            printf(" %d",local_60);
            printf(" %d",(ulong)uVar25);
            printf(" %d",uVar21);
            printf(" %d");
            putchar(10);
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 != 3);
        uVar20 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar20;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_60 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  iVar3 = 0;
  local_60 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      uVar21 = 0;
      do {
        uVar15 = 0;
        do {
          iVar4 = 0;
          do {
            iVar5 = xmlMemBlocks();
            if (bVar22) {
              lVar9 = xmlHashCreate(10);
            }
            else {
              lVar9 = 0;
            }
            if (uVar25 < 4) {
              uVar16 = (&DAT_00165d70)[uVar25];
            }
            else {
              uVar16 = 0;
            }
            if ((uint)uVar21 < 4) {
              uVar13 = (&DAT_00165d70)[uVar21];
            }
            else {
              uVar13 = 0;
            }
            if ((uint)uVar15 < 4) {
              uVar11 = (&DAT_00165d70)[uVar15];
            }
            else {
              uVar11 = 0;
            }
            piVar12 = &call_tests;
            if (iVar4 != 0) {
              if (iVar4 == 1) {
                piVar12 = (int *)0xffffffffffffffff;
              }
              else {
                piVar12 = (int *)0x0;
              }
            }
            xmlHashAddEntry3(lVar9,uVar16,uVar13,uVar11,piVar12);
            call_tests = call_tests + 1;
            if (lVar9 != 0) {
              xmlHashFree(lVar9);
            }
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar5 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashAddEntry3",(ulong)(uint)(iVar6 - iVar5));
              iVar3 = iVar3 + 1;
              printf(" %d",local_60);
              printf(" %d",(ulong)uVar25);
              printf(" %d",uVar21);
              printf(" %d",uVar15);
              printf(" %d");
              putchar(10);
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 != 3);
          uVar20 = (uint)uVar15 + 1;
          uVar15 = (ulong)uVar20;
        } while (uVar20 != 5);
        uVar20 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar20;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_60 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar25 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar20 = 0;
    puVar23 = &DAT_00165d70;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar20 < 4) {
        uVar16 = *puVar23;
      }
      else {
        uVar16 = 0;
      }
      xmlHashDefaultDeallocator(0,uVar16);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHashDefaultDeallocator",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
      }
      uVar20 = uVar20 + 1;
      puVar23 = puVar23 + 1;
    } while (uVar20 != 5);
    uVar25 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  local_48 = 0;
  uVar25 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar20 = 0;
    puVar23 = &DAT_00165d70;
    do {
      iVar5 = xmlMemBlocks();
      if (bVar22) {
        lVar9 = xmlHashCreate(10);
      }
      else {
        lVar9 = 0;
      }
      if (uVar20 < 4) {
        uVar16 = *puVar23;
      }
      else {
        uVar16 = 0;
      }
      xmlHashLookup(lVar9,uVar16);
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlHashFree(lVar9);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHashLookup",(ulong)(uint)(iVar6 - iVar5));
        local_48 = local_48 + 1;
        printf(" %d",(ulong)uVar25);
        printf(" %d");
        putchar(10);
      }
      uVar20 = uVar20 + 1;
      puVar23 = puVar23 + 1;
    } while (uVar20 != 5);
    uVar25 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  local_44 = 0;
  local_68 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      puVar23 = &DAT_00165d70;
      uVar20 = 0;
      do {
        iVar5 = xmlMemBlocks();
        if (bVar22) {
          lVar9 = xmlHashCreate(10);
        }
        else {
          lVar9 = 0;
        }
        if (uVar25 < 4) {
          uVar16 = (&DAT_00165d70)[uVar25];
        }
        else {
          uVar16 = 0;
        }
        if (uVar20 < 4) {
          uVar13 = *puVar23;
        }
        else {
          uVar13 = 0;
        }
        xmlHashLookup2(lVar9,uVar16,uVar13);
        call_tests = call_tests + 1;
        if (lVar9 != 0) {
          xmlHashFree(lVar9);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashLookup2",(ulong)(uint)(iVar6 - iVar5));
          local_44 = local_44 + 1;
          printf(" %d",local_68);
          printf(" %d",(ulong)uVar25);
          printf(" %d");
          putchar(10);
        }
        uVar20 = uVar20 + 1;
        puVar23 = puVar23 + 1;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_68 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  iVar5 = 0;
  local_58 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      uVar21 = 0;
      do {
        uVar20 = 0;
        puVar23 = &DAT_00165d70;
        do {
          iVar6 = xmlMemBlocks();
          if (bVar22) {
            lVar9 = xmlHashCreate(10);
          }
          else {
            lVar9 = 0;
          }
          if (uVar25 < 4) {
            uVar16 = (&DAT_00165d70)[uVar25];
          }
          else {
            uVar16 = 0;
          }
          if ((uint)uVar21 < 4) {
            uVar13 = (&DAT_00165d70)[uVar21];
          }
          else {
            uVar13 = 0;
          }
          if (uVar20 < 4) {
            uVar11 = *puVar23;
          }
          else {
            uVar11 = 0;
          }
          xmlHashLookup3(lVar9,uVar16,uVar13,uVar11);
          call_tests = call_tests + 1;
          if (lVar9 != 0) {
            xmlHashFree(lVar9);
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashLookup3",(ulong)(uint)(iVar7 - iVar6));
            iVar5 = iVar5 + 1;
            printf(" %d",local_58);
            printf(" %d",(ulong)uVar25);
            printf(" %d",uVar21);
            printf(" %d");
            putchar(10);
          }
          uVar20 = uVar20 + 1;
          puVar23 = puVar23 + 1;
        } while (uVar20 != 5);
        uVar20 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar20;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_58 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  local_38 = 0;
  local_68 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      puVar23 = &DAT_00165d70;
      uVar20 = 0;
      do {
        iVar6 = xmlMemBlocks();
        if (bVar22) {
          lVar9 = xmlHashCreate(10);
        }
        else {
          lVar9 = 0;
        }
        if (uVar25 < 4) {
          uVar16 = (&DAT_00165d70)[uVar25];
        }
        else {
          uVar16 = 0;
        }
        if (uVar20 < 4) {
          uVar13 = *puVar23;
        }
        else {
          uVar13 = 0;
        }
        xmlHashQLookup(lVar9,uVar16,uVar13);
        call_tests = call_tests + 1;
        if (lVar9 != 0) {
          xmlHashFree(lVar9);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashQLookup",(ulong)(uint)(iVar7 - iVar6));
          local_38 = local_38 + 1;
          printf(" %d",local_68);
          printf(" %d",(ulong)uVar25);
          printf(" %d");
          putchar(10);
        }
        uVar20 = uVar20 + 1;
        puVar23 = puVar23 + 1;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_68 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  iVar1 = iVar19 + iVar1 + iVar3 + iVar4 + local_48 + local_44;
  local_34 = 0;
  local_58 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      uVar21 = 0;
      do {
        uVar15 = 0;
        do {
          puVar23 = &DAT_00165d70;
          uVar20 = 0;
          do {
            iVar19 = xmlMemBlocks();
            if (bVar22) {
              lVar9 = xmlHashCreate(10);
            }
            else {
              lVar9 = 0;
            }
            if (uVar25 < 4) {
              uVar16 = (&DAT_00165d70)[uVar25];
            }
            else {
              uVar16 = 0;
            }
            if ((uint)uVar21 < 4) {
              uVar13 = (&DAT_00165d70)[uVar21];
            }
            else {
              uVar13 = 0;
            }
            if ((uint)uVar15 < 4) {
              uVar11 = (&DAT_00165d70)[uVar15];
            }
            else {
              uVar11 = 0;
            }
            if (uVar20 < 4) {
              uVar17 = *puVar23;
            }
            else {
              uVar17 = 0;
            }
            xmlHashQLookup2(lVar9,uVar16,uVar13,uVar11,uVar17);
            call_tests = call_tests + 1;
            if (lVar9 != 0) {
              xmlHashFree(lVar9);
            }
            xmlResetLastError();
            iVar3 = xmlMemBlocks();
            if (iVar19 != iVar3) {
              iVar3 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashQLookup2",(ulong)(uint)(iVar3 - iVar19));
              local_34 = local_34 + 1;
              printf(" %d",local_58);
              printf(" %d",(ulong)uVar25);
              printf(" %d",uVar21);
              printf(" %d",uVar15);
              printf(" %d");
              putchar(10);
            }
            uVar20 = uVar20 + 1;
            puVar23 = puVar23 + 1;
          } while (uVar20 != 5);
          uVar20 = (uint)uVar15 + 1;
          uVar15 = (ulong)uVar20;
        } while (uVar20 != 5);
        uVar20 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar20;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_58 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  local_44 = 0;
  local_48 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      uVar20 = 0;
      do {
        uVar8 = 0;
        do {
          uVar21 = 0;
          do {
            uVar15 = 0;
            do {
              puVar23 = &DAT_00165d70;
              uVar26 = 0;
              do {
                iVar19 = xmlMemBlocks();
                if (bVar22) {
                  lVar9 = xmlHashCreate(10);
                }
                else {
                  lVar9 = 0;
                }
                if (uVar25 < 4) {
                  uVar16 = (&DAT_00165d70)[uVar25];
                }
                else {
                  uVar16 = 0;
                }
                if (uVar20 < 4) {
                  uVar13 = (&DAT_00165d70)[uVar20];
                }
                else {
                  uVar13 = 0;
                }
                if (uVar8 < 4) {
                  uVar11 = (&DAT_00165d70)[uVar8];
                }
                else {
                  uVar11 = 0;
                }
                if ((uint)uVar21 < 4) {
                  uVar17 = (&DAT_00165d70)[uVar21];
                }
                else {
                  uVar17 = 0;
                }
                if ((uint)uVar15 < 4) {
                  uVar18 = (&DAT_00165d70)[uVar15];
                }
                else {
                  uVar18 = 0;
                }
                if (uVar26 < 4) {
                  uVar10 = *puVar23;
                }
                else {
                  uVar10 = 0;
                }
                xmlHashQLookup3(lVar9,uVar16,uVar13,uVar11,uVar17,uVar18,uVar10);
                call_tests = call_tests + 1;
                if (lVar9 != 0) {
                  xmlHashFree(lVar9);
                }
                xmlResetLastError();
                iVar3 = xmlMemBlocks();
                if (iVar19 != iVar3) {
                  iVar3 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlHashQLookup3",(ulong)(uint)(iVar3 - iVar19))
                  ;
                  local_44 = local_44 + 1;
                  printf(" %d",(ulong)local_48);
                  printf(" %d",(ulong)uVar25);
                  printf(" %d",(ulong)uVar20);
                  printf(" %d",(ulong)uVar8);
                  printf(" %d",uVar21);
                  printf(" %d",uVar15);
                  printf(" %d");
                  putchar(10);
                }
                uVar26 = uVar26 + 1;
                puVar23 = puVar23 + 1;
              } while (uVar26 != 5);
              uVar26 = (uint)uVar15 + 1;
              uVar15 = (ulong)uVar26;
            } while (uVar26 != 5);
            uVar26 = (uint)uVar21 + 1;
            uVar21 = (ulong)uVar26;
          } while (uVar26 != 5);
          uVar8 = uVar8 + 1;
        } while (uVar8 != 5);
        uVar20 = uVar20 + 1;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_48 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  iVar1 = iVar1 + iVar5 + local_38;
  local_38 = 0;
  local_68 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      bVar2 = true;
      do {
        bVar24 = bVar2;
        iVar19 = xmlMemBlocks();
        if (bVar22) {
          lVar9 = xmlHashCreate(10);
        }
        else {
          lVar9 = 0;
        }
        if (uVar25 < 4) {
          uVar16 = (&DAT_00165d70)[uVar25];
        }
        else {
          uVar16 = 0;
        }
        pcVar14 = (code *)0x0;
        if (bVar24) {
          pcVar14 = test_xmlHashDeallocator;
        }
        xmlHashRemoveEntry(lVar9,uVar16,pcVar14);
        call_tests = call_tests + 1;
        if (lVar9 != 0) {
          xmlHashFree(lVar9);
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar19 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashRemoveEntry",(ulong)(uint)(iVar3 - iVar19));
          local_38 = local_38 + 1;
          printf(" %d",local_68);
          printf(" %d",(ulong)uVar25);
          printf(" %d");
          putchar(10);
        }
        bVar2 = false;
      } while (bVar24);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_68 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  local_48 = 0;
  local_58 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      uVar21 = 0;
      do {
        bVar2 = true;
        do {
          bVar24 = bVar2;
          iVar19 = xmlMemBlocks();
          if (bVar22) {
            lVar9 = xmlHashCreate(10);
          }
          else {
            lVar9 = 0;
          }
          if (uVar25 < 4) {
            uVar16 = (&DAT_00165d70)[uVar25];
          }
          else {
            uVar16 = 0;
          }
          if ((uint)uVar21 < 4) {
            uVar13 = (&DAT_00165d70)[uVar21];
          }
          else {
            uVar13 = 0;
          }
          pcVar14 = (code *)0x0;
          if (bVar24) {
            pcVar14 = test_xmlHashDeallocator;
          }
          xmlHashRemoveEntry2(lVar9,uVar16,uVar13,pcVar14);
          call_tests = call_tests + 1;
          if (lVar9 != 0) {
            xmlHashFree(lVar9);
          }
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar19 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashRemoveEntry2",(ulong)(uint)(iVar3 - iVar19));
            local_48 = local_48 + 1;
            printf(" %d",local_58);
            printf(" %d",(ulong)uVar25);
            printf(" %d",uVar21);
            printf(" %d");
            putchar(10);
          }
          bVar2 = false;
        } while (bVar24);
        uVar20 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar20;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_58 = 1;
    bVar2 = false;
  } while (bVar22);
  iVar19 = iVar1 + local_34 + local_44;
  function_tests = function_tests + 1;
  iVar1 = 0;
  local_58 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      uVar21 = 0;
      do {
        uVar15 = 0;
        do {
          bVar2 = true;
          do {
            bVar24 = bVar2;
            iVar3 = xmlMemBlocks();
            if (bVar22) {
              lVar9 = xmlHashCreate(10);
            }
            else {
              lVar9 = 0;
            }
            if (uVar25 < 4) {
              uVar16 = (&DAT_00165d70)[uVar25];
            }
            else {
              uVar16 = 0;
            }
            if ((uint)uVar21 < 4) {
              uVar13 = (&DAT_00165d70)[uVar21];
            }
            else {
              uVar13 = 0;
            }
            if ((uint)uVar15 < 4) {
              uVar11 = (&DAT_00165d70)[uVar15];
            }
            else {
              uVar11 = 0;
            }
            pcVar14 = (code *)0x0;
            if (bVar24) {
              pcVar14 = test_xmlHashDeallocator;
            }
            xmlHashRemoveEntry3(lVar9,uVar16,uVar13,uVar11,pcVar14);
            call_tests = call_tests + 1;
            if (lVar9 != 0) {
              xmlHashFree(lVar9);
            }
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashRemoveEntry3",(ulong)(uint)(iVar4 - iVar3));
              iVar1 = iVar1 + 1;
              printf(" %d",local_58);
              printf(" %d",(ulong)uVar25);
              printf(" %d",uVar21);
              printf(" %d",uVar15);
              printf(" %d");
              putchar(10);
            }
            bVar2 = false;
          } while (bVar24);
          uVar20 = (uint)uVar15 + 1;
          uVar15 = (ulong)uVar20;
        } while (uVar20 != 5);
        uVar20 = (uint)uVar21 + 1;
        uVar21 = (ulong)uVar20;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_58 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  local_44 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    iVar3 = xmlMemBlocks();
    if (bVar22) {
      lVar9 = xmlHashCreate(10);
    }
    else {
      lVar9 = 0;
    }
    xmlHashSize(lVar9);
    call_tests = call_tests + 1;
    if (lVar9 != 0) {
      xmlHashFree(lVar9,0);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHashSize",(ulong)(uint)(iVar4 - iVar3));
      local_44 = local_44 + 1;
      printf(" %d");
      putchar(10);
    }
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  iVar19 = iVar19 + local_38 + local_48;
  local_34 = 0;
  local_58 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      uVar21 = 0;
      do {
        bVar2 = true;
        do {
          bVar24 = bVar2;
          iVar3 = xmlMemBlocks();
          if (bVar22) {
            lVar9 = xmlHashCreate(10);
          }
          else {
            lVar9 = 0;
          }
          if (uVar25 < 4) {
            uVar16 = (&DAT_00165d70)[uVar25];
          }
          else {
            uVar16 = 0;
          }
          piVar12 = &call_tests;
          iVar4 = (int)uVar21;
          if (iVar4 != 0) {
            if (iVar4 == 1) {
              piVar12 = (int *)0xffffffffffffffff;
            }
            else {
              piVar12 = (int *)0x0;
            }
          }
          pcVar14 = (code *)0x0;
          if (bVar24) {
            pcVar14 = test_xmlHashDeallocator;
          }
          xmlHashUpdateEntry(lVar9,uVar16,piVar12,pcVar14);
          call_tests = call_tests + 1;
          if (lVar9 != 0) {
            xmlHashFree(lVar9);
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar3 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlHashUpdateEntry",(ulong)(uint)(iVar5 - iVar3));
            local_34 = local_34 + 1;
            printf(" %d",local_58);
            printf(" %d",(ulong)uVar25);
            printf(" %d",uVar21);
            printf(" %d");
            putchar(10);
          }
          bVar2 = false;
        } while (bVar24);
        uVar21 = (ulong)(iVar4 + 1U);
      } while (iVar4 + 1U != 3);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_58 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  local_48 = 0;
  local_40 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      uVar20 = 0;
      do {
        uVar21 = 0;
        do {
          bVar2 = true;
          do {
            bVar24 = bVar2;
            iVar3 = xmlMemBlocks();
            if (bVar22) {
              lVar9 = xmlHashCreate(10);
            }
            else {
              lVar9 = 0;
            }
            if (uVar25 < 4) {
              uVar16 = (&DAT_00165d70)[uVar25];
            }
            else {
              uVar16 = 0;
            }
            if (uVar20 < 4) {
              uVar13 = (&DAT_00165d70)[uVar20];
            }
            else {
              uVar13 = 0;
            }
            piVar12 = &call_tests;
            iVar4 = (int)uVar21;
            if (iVar4 != 0) {
              if (iVar4 == 1) {
                piVar12 = (int *)0xffffffffffffffff;
              }
              else {
                piVar12 = (int *)0x0;
              }
            }
            pcVar14 = (code *)0x0;
            if (bVar24) {
              pcVar14 = test_xmlHashDeallocator;
            }
            xmlHashUpdateEntry2(lVar9,uVar16,uVar13,piVar12,pcVar14);
            call_tests = call_tests + 1;
            if (lVar9 != 0) {
              xmlHashFree(lVar9);
            }
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar3 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlHashUpdateEntry2",(ulong)(uint)(iVar5 - iVar3));
              local_48 = local_48 + 1;
              printf(" %d",local_40);
              printf(" %d",(ulong)uVar25);
              printf(" %d",(ulong)uVar20);
              printf(" %d",uVar21);
              printf(" %d");
              putchar(10);
            }
            bVar2 = false;
          } while (bVar24);
          uVar21 = (ulong)(iVar4 + 1U);
        } while (iVar4 + 1U != 3);
        uVar20 = uVar20 + 1;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_40 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  iVar19 = iVar19 + iVar1 + local_44;
  iVar1 = 0;
  local_44 = 0;
  bVar2 = true;
  do {
    bVar22 = bVar2;
    uVar25 = 0;
    do {
      uVar20 = 0;
      do {
        uVar21 = 0;
        do {
          uVar15 = 0;
          do {
            bVar2 = true;
            do {
              bVar24 = bVar2;
              iVar3 = xmlMemBlocks();
              if (bVar22) {
                lVar9 = xmlHashCreate(10);
              }
              else {
                lVar9 = 0;
              }
              if (uVar25 < 4) {
                uVar16 = (&DAT_00165d70)[uVar25];
              }
              else {
                uVar16 = 0;
              }
              if (uVar20 < 4) {
                uVar13 = (&DAT_00165d70)[uVar20];
              }
              else {
                uVar13 = 0;
              }
              if ((uint)uVar21 < 4) {
                uVar11 = (&DAT_00165d70)[uVar21];
              }
              else {
                uVar11 = 0;
              }
              piVar12 = &call_tests;
              iVar4 = (int)uVar15;
              if (iVar4 != 0) {
                if (iVar4 == 1) {
                  piVar12 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar12 = (int *)0x0;
                }
              }
              pcVar14 = (code *)0x0;
              if (bVar24) {
                pcVar14 = test_xmlHashDeallocator;
              }
              xmlHashUpdateEntry3(lVar9,uVar16,uVar13,uVar11,piVar12,pcVar14);
              call_tests = call_tests + 1;
              if (lVar9 != 0) {
                xmlHashFree(lVar9);
              }
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar3 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlHashUpdateEntry3",(ulong)(uint)(iVar5 - iVar3)
                      );
                iVar1 = iVar1 + 1;
                printf(" %d",(ulong)local_44);
                printf(" %d",(ulong)uVar25);
                printf(" %d",(ulong)uVar20);
                printf(" %d",uVar21);
                printf(" %d",uVar15);
                printf(" %d");
                putchar(10);
              }
              bVar2 = false;
            } while (bVar24);
            uVar15 = (ulong)(iVar4 + 1U);
          } while (iVar4 + 1U != 3);
          uVar8 = (uint)uVar21 + 1;
          uVar21 = (ulong)uVar8;
        } while (uVar8 != 5);
        uVar20 = uVar20 + 1;
      } while (uVar20 != 5);
      uVar25 = uVar25 + 1;
    } while (uVar25 != 5);
    local_44 = 1;
    bVar2 = false;
  } while (bVar22);
  function_tests = function_tests + 1;
  uVar25 = iVar19 + local_34 + local_48 + iVar1;
  if (uVar25 != 0) {
    printf("Module hash: %d errors\n",(ulong)uVar25);
  }
  return uVar25;
}

Assistant:

static int
test_hash(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing hash : 17 of 25 functions ...\n");
    test_ret += test_xmlHashAddEntry();
    test_ret += test_xmlHashAddEntry2();
    test_ret += test_xmlHashAddEntry3();
    test_ret += test_xmlHashCopy();
    test_ret += test_xmlHashCreate();
    test_ret += test_xmlHashCreateDict();
    test_ret += test_xmlHashDefaultDeallocator();
    test_ret += test_xmlHashLookup();
    test_ret += test_xmlHashLookup2();
    test_ret += test_xmlHashLookup3();
    test_ret += test_xmlHashQLookup();
    test_ret += test_xmlHashQLookup2();
    test_ret += test_xmlHashQLookup3();
    test_ret += test_xmlHashRemoveEntry();
    test_ret += test_xmlHashRemoveEntry2();
    test_ret += test_xmlHashRemoveEntry3();
    test_ret += test_xmlHashScan();
    test_ret += test_xmlHashScan3();
    test_ret += test_xmlHashScanFull();
    test_ret += test_xmlHashScanFull3();
    test_ret += test_xmlHashSize();
    test_ret += test_xmlHashUpdateEntry();
    test_ret += test_xmlHashUpdateEntry2();
    test_ret += test_xmlHashUpdateEntry3();

    if (test_ret != 0)
	printf("Module hash: %d errors\n", test_ret);
    return(test_ret);
}